

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.H
# Opt level: O2

int __thiscall
amrex::ParmParse::queryAdd<double>
          (ParmParse *this,char *name,vector<double,_std::allocator<double>_> *ref)

{
  int iVar1;
  
  iVar1 = queryarr(this,name,ref,0,-1);
  if ((iVar1 == 0) &&
     ((ref->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (ref->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    addarr(this,name,ref);
  }
  return iVar1;
}

Assistant:

int queryAdd (const char* name, std::vector<T>& ref) {
        int exist = this->queryarr(name, ref);
        if (!exist && !ref.empty()) {
            this->addarr(name, ref);
        }
        return exist;
    }